

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# molecule.cpp
# Opt level: O1

void __thiscall indigox::Molecule::~Molecule(Molecule *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Atomic_word *p_Var2;
  ElectronOpt *__ptr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer pcVar4;
  int iVar5;
  
  __ptr = (this->elnopt_)._M_t.
          super___uniq_ptr_impl<indigox::ElectronOpt,_std::default_delete<indigox::ElectronOpt>_>.
          _M_t.
          super__Tuple_impl<0UL,_indigox::ElectronOpt_*,_std::default_delete<indigox::ElectronOpt>_>
          .super__Head_base<0UL,_indigox::ElectronOpt_*,_false>._M_head_impl;
  if (__ptr != (ElectronOpt *)0x0) {
    std::default_delete<indigox::ElectronOpt>::operator()
              ((default_delete<indigox::ElectronOpt> *)&this->elnopt_,__ptr);
  }
  (this->elnopt_)._M_t.
  super___uniq_ptr_impl<indigox::ElectronOpt,_std::default_delete<indigox::ElectronOpt>_>._M_t.
  super__Tuple_impl<0UL,_indigox::ElectronOpt_*,_std::default_delete<indigox::ElectronOpt>_>.
  super__Head_base<0UL,_indigox::ElectronOpt_*,_false>._M_head_impl = (ElectronOpt *)0x0;
  p_Var3 = (this->graph_).super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  std::
  _Rb_tree<std::shared_ptr<indigox::Bond>,_std::pair<const_std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>,_std::_Select1st<std::pair<const_std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>_>,_std::less<std::shared_ptr<indigox::Bond>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>_>_>
  ::~_Rb_tree(&(this->bond_to_edge_)._M_t);
  std::
  _Rb_tree<std::shared_ptr<indigox::Atom>,_std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>,_std::_Select1st<std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>_>,_std::less<std::shared_ptr<indigox::Atom>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>_>_>
  ::~_Rb_tree(&(this->atom_to_vertex_)._M_t);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->idx_to_bond_)._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::weak_ptr<indigox::Atom>_>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Atom>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->idx_to_atom_)._M_h);
  std::vector<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>::
  ~vector(&this->bonds_);
  std::vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>::
  ~vector(&this->atoms_);
  pcVar4 = (this->name_)._M_dataplus._M_p;
  paVar1 = &(this->name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  p_Var3 = (this->super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
           super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2 = &p_Var3->_M_weak_count;
      iVar5 = *p_Var2;
      *p_Var2 = *p_Var2 + -1;
      UNLOCK();
    }
    else {
      iVar5 = p_Var3->_M_weak_count;
      p_Var3->_M_weak_count = iVar5 + -1;
    }
    if (iVar5 == 1) {
      (*p_Var3->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

Molecule::~Molecule() { }